

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
::val(value_type *__return_storage_ptr__,
     FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
     *this)

{
  double dVar1;
  uint uVar2;
  Fad<Fad<double>_> *pFVar3;
  double *pdVar4;
  int lsz;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  value_type local_40;
  
  FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
  ::val(&local_40,&this->left_->fadexpr_);
  pFVar3 = this->right_;
  __return_storage_ptr__->val_ = local_40.val_ / (pFVar3->val_).val_;
  uVar2 = (pFVar3->val_).dx_.num_elts;
  if ((int)uVar2 < local_40.dx_.num_elts) {
    uVar2 = local_40.dx_.num_elts;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar2) {
    (__return_storage_ptr__->dx_).num_elts = uVar2;
    pdVar4 = (double *)operator_new__((ulong)uVar2 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  uVar2 = (pFVar3->val_).dx_.num_elts;
  uVar5 = uVar2;
  if ((int)uVar2 < local_40.dx_.num_elts) {
    uVar5 = local_40.dx_.num_elts;
  }
  if (0 < (int)uVar5) {
    pdVar4 = (__return_storage_ptr__->dx_).ptr_to_data;
    uVar6 = (ulong)uVar5;
    lVar7 = 0;
    do {
      pdVar8 = (double *)((long)local_40.dx_.ptr_to_data + lVar7);
      if (local_40.dx_.num_elts == 0) {
        pdVar8 = &local_40.defaultVal;
      }
      pdVar9 = (double *)((long)(pFVar3->val_).dx_.ptr_to_data + lVar7);
      if (uVar2 == 0) {
        pdVar9 = &(pFVar3->val_).defaultVal;
      }
      dVar1 = (pFVar3->val_).val_;
      *(double *)((long)pdVar4 + lVar7) =
           (*pdVar8 * dVar1 - local_40.val_ * *pdVar9) / (dVar1 * dVar1);
      lVar7 = lVar7 + 8;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  Fad<double>::~Fad(&local_40);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}